

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

LookupParameters * __thiscall cnn::Model::add_lookup_parameters(Model *this,uint n,Dim *d)

{
  iterator __position;
  iterator __position_00;
  LookupParameters *this_00;
  LookupParameters *p;
  LookupParameters *local_30;
  LookupParameters *local_28;
  
  this_00 = (LookupParameters *)operator_new(0x98);
  LookupParameters::LookupParameters(this_00,n,d);
  __position._M_current = *(ParametersBase ***)(this + 8);
  local_28 = this_00;
  local_30 = this_00;
  if (__position._M_current == *(ParametersBase ***)(this + 0x10)) {
    std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
    _M_realloc_insert<cnn::ParametersBase*>
              ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,__position,
               (ParametersBase **)&local_30);
  }
  else {
    *__position._M_current = (ParametersBase *)this_00;
    *(long *)(this + 8) = *(long *)(this + 8) + 8;
  }
  __position_00._M_current = *(LookupParameters ***)(this + 0x38);
  if (__position_00._M_current == *(LookupParameters ***)(this + 0x40)) {
    std::vector<cnn::LookupParameters*,std::allocator<cnn::LookupParameters*>>::
    _M_realloc_insert<cnn::LookupParameters*const&>
              ((vector<cnn::LookupParameters*,std::allocator<cnn::LookupParameters*>> *)
               (this + 0x30),__position_00,&local_28);
  }
  else {
    *__position_00._M_current = this_00;
    *(long *)(this + 0x38) = *(long *)(this + 0x38) + 8;
    local_28 = this_00;
  }
  return local_28;
}

Assistant:

LookupParameters* Model::add_lookup_parameters(unsigned n, const Dim& d) {
  LookupParameters* p = new LookupParameters(n,d);
  all_params.push_back(p);
  lookup_params.push_back(p);
  return p;
}